

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

from_chars_result __thiscall
semver::detail::version_parser::parse_build_metadata(version_parser *this,string *out)

{
  bool bVar1;
  ulong uVar2;
  size_t k;
  char *ptr;
  from_chars_result fVar3;
  string local_78 [8];
  string identifier;
  string local_48 [8];
  string result;
  string *out_local;
  version_parser *this_local;
  from_chars_result res;
  
  std::__cxx11::string::string(local_48);
  do {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::push_back((char)local_48);
    }
    std::__cxx11::string::string(local_78);
    fVar3 = parse_build_identifier(this,(string *)local_78);
    this_local = (version_parser *)fVar3.super_from_chars_result.ptr;
    res.super_from_chars_result.ptr._0_4_ = fVar3.super_from_chars_result.ec;
    bVar1 = from_chars_result::operator_cast_to_bool((from_chars_result *)&this_local);
    if (bVar1) {
      std::__cxx11::string::append(local_48);
    }
    std::__cxx11::string::~string(local_78);
    if (!bVar1) goto LAB_00105587;
    bVar1 = token_stream::advanceIfMatch(this->stream,dot);
  } while (bVar1);
  std::__cxx11::string::operator=((string *)out,local_48);
  token_stream::peek((token *)this->stream,(token_stream *)0x0,k);
  fVar3 = success(ptr);
  this_local = (version_parser *)fVar3.super_from_chars_result.ptr;
  res.super_from_chars_result.ptr._0_4_ = fVar3.super_from_chars_result.ec;
LAB_00105587:
  std::__cxx11::string::~string(local_48);
  fVar3.super_from_chars_result.ec = (errc)res.super_from_chars_result.ptr;
  fVar3.super_from_chars_result.ptr = (char *)this_local;
  fVar3.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar3.super_from_chars_result;
}

Assistant:

parse_build_metadata(std::string& out) {
    std::string result;

    do {
      if (!result.empty()) {
        result.push_back('.');
      }

      std::string identifier;
      if (const auto res = parse_build_identifier(identifier); !res) {
        return res;
      }

      result.append(identifier);
    } while (stream.advanceIfMatch(token_type::dot));

    out = result;
    return success(stream.peek().lexeme);
  }